

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

char * vkb::to_string(QueueError err)

{
  char *pcStack_10;
  QueueError err_local;
  
  switch(err) {
  case present_unavailable:
    pcStack_10 = "present_unavailable";
    break;
  case graphics_unavailable:
    pcStack_10 = "graphics_unavailable";
    break;
  case compute_unavailable:
    pcStack_10 = "compute_unavailable";
    break;
  case transfer_unavailable:
    pcStack_10 = "transfer_unavailable";
    break;
  case queue_index_out_of_range:
    pcStack_10 = "queue_index_out_of_range";
    break;
  case invalid_queue_family_index:
    pcStack_10 = "invalid_queue_family_index";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* to_string(QueueError err) {
    switch (err) {
        CASE_TO_STRING(QueueError, present_unavailable)
        CASE_TO_STRING(QueueError, graphics_unavailable)
        CASE_TO_STRING(QueueError, compute_unavailable)
        CASE_TO_STRING(QueueError, transfer_unavailable)
        CASE_TO_STRING(QueueError, queue_index_out_of_range)
        CASE_TO_STRING(QueueError, invalid_queue_family_index)
        default:
            return "";
    }
}